

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20240722::Cord::Cord(Cord *this,string_view src,MethodIdentifier method)

{
  Nullable<CordRep_*> pCVar1;
  SamplingState *pSVar2;
  long lVar3;
  Nullable<const_char_*> data;
  ulong length;
  
  data = src._M_str;
  length = src._M_len;
  if (length < 0x10) {
    cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
    return;
  }
  pCVar1 = NewTree(data,length,(size_t)data);
  if (pCVar1 != (Nullable<CordRep_*>)0x0) {
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar1;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
    pSVar2 = (SamplingState *)__tls_get_addr(&PTR_0011efd0);
    if (pSVar2->next_sample < 2) {
      lVar3 = absl::lts_20240722::cord_internal::cordz_should_profile_slow(pSVar2);
    }
    else {
      pSVar2->next_sample = pSVar2->next_sample + -1;
      lVar3 = 0;
    }
    if (lVar3 < 1) {
      return;
    }
    absl::lts_20240722::cord_internal::CordzInfo::TrackCord((InlineData *)this,method,lVar3);
    return;
  }
  __assert_fail("rep",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                ,0x4f2,
                "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
               );
}

Assistant:

Cord::Cord(absl::string_view src, MethodIdentifier method)
    : contents_(InlineData::kDefaultInit) {
  const size_t n = src.size();
  if (n <= InlineRep::kMaxInline) {
    contents_.set_data(src.data(), n);
  } else {
    CordRep* rep = NewTree(src.data(), n, 0);
    contents_.EmplaceTree(rep, method);
  }
}